

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O2

void __thiscall
QOpenGLFunctions::glBindFramebuffer(QOpenGLFunctions *this,GLenum target,GLuint framebuffer)

{
  if (framebuffer == 0) {
    QOpenGLContext::currentContext();
    framebuffer = QOpenGLContext::defaultFramebufferObject();
  }
  (**(code **)(*(long *)this + 0x198))(target,framebuffer);
  return;
}

Assistant:

inline void QOpenGLFunctions::glBindFramebuffer(GLenum target, GLuint framebuffer)
{
    if (framebuffer == 0)
        framebuffer = QOpenGLContext::currentContext()->defaultFramebufferObject();
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glBindFramebuffer(target, framebuffer);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.BindFramebuffer(target, framebuffer);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}